

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

Cluster * __thiscall mkvparser::Segment::GetFirst(Segment *this)

{
  Cluster *pCVar1;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    pCVar1 = &this->m_eos;
  }
  else {
    pCVar1 = *this->m_clusters;
    if (pCVar1 == (Cluster *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9ca,"const Cluster *mkvparser::Segment::GetFirst() const");
    }
  }
  return pCVar1;
}

Assistant:

const Cluster* Segment::GetFirst() const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  Cluster* const pCluster = m_clusters[0];
  assert(pCluster);

  return pCluster;
}